

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall JsonNumber_Uint64Max_Test::TestBody(JsonNumber_Uint64Max_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_(unsigned_long)> *this_00;
  TypedExpectation<std::error_code_(unsigned_long)> *this_01;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  char *message;
  char *in_R9;
  string local_198;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_;
  string local_148;
  mock_json_callbacks *local_128;
  undefined1 local_120 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  Matcher<unsigned_long> local_78;
  MockSpec<std::error_code_(unsigned_long)> local_60;
  string local_30;
  JsonNumber_Uint64Max_Test *local_10;
  JsonNumber_Uint64Max_Test *this_local;
  
  local_10 = this;
  std::__cxx11::to_string(&local_30,0xffffffffffffffff);
  bVar1 = std::operator==("18446744073709551615",&local_30);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_30);
    testing::Matcher<unsigned_long>::Matcher(&local_78,0xffffffffffffffff);
    mock_json_callbacks::gmock_uint64_value
              (&local_60,&(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,&local_78);
    testing::internal::GetWithoutMatchers();
    this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::operator()
                        (&local_60,(WithoutMatchers *)((long)&p.coordinate_.row + 3),(void *)0x0);
    this_01 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                        (this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                         ,0xd1,"callbacks_","uint64_value (uint64_max)");
    testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_01,1);
    testing::internal::MockSpec<std::error_code_(unsigned_long)>::~MockSpec(&local_60);
    testing::Matcher<unsigned_long>::~Matcher(&local_78);
    local_128 = (this->super_JsonNumber).proxy_.original_;
    pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
              ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_120,
               (callbacks_proxy<mock_json_callbacks>)local_128,none);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,"18446744073709551615",
               (allocator *)
               ((long)&gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_120,&local_148);
    pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_161 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                          ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_120);
    local_161 = !local_161;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_160,&local_161,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_198,(internal *)local_160,(AssertionResult *)"p.has_error ()","true","false"
                 ,in_R9);
      message = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                 ,0xd4,message);
      testing::internal::AssertHelper::operator=(&local_178,&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
              ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_120);
    return;
  }
  pstore::assert_failed
            ("uint64_max_str == std::to_string (uint64_max) && \"The hard-wired unsigned 64-bit max string seems to be incorrect\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
             ,0xd0);
}

Assistant:

TEST_F (JsonNumber, Uint64Max) {
    PSTORE_ASSERT (uint64_max_str == std::to_string (uint64_max) &&
                   "The hard-wired unsigned 64-bit max string seems to be incorrect");
    EXPECT_CALL (callbacks_, uint64_value (uint64_max)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (std::string{uint64_max_str}).eof ();
    EXPECT_FALSE (p.has_error ());
}